

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFieldsToString
          (Printer *this,UnknownFieldSet *unknown_fields,string *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  undefined1 local_80 [8];
  StringOutputStream output_stream;
  LogMessage local_58;
  string *local_20;
  string *output_local;
  UnknownFieldSet *unknown_fields_local;
  Printer *this_local;
  
  local_20 = output;
  output_local = (string *)unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)this;
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/text_format.cc"
               ,0x47d);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: output: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"output specified is NULL");
    internal::LogFinisher::operator=((LogFinisher *)((long)&output_stream.target_ + 3),pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  std::__cxx11::string::clear();
  io::StringOutputStream::StringOutputStream((StringOutputStream *)local_80,local_20);
  bVar1 = PrintUnknownFields(this,(UnknownFieldSet *)output_local,(ZeroCopyOutputStream *)local_80);
  io::StringOutputStream::~StringOutputStream((StringOutputStream *)local_80);
  return bVar1;
}

Assistant:

bool TextFormat::Printer::PrintUnknownFieldsToString(
    const UnknownFieldSet& unknown_fields,
    string* output) const {
  GOOGLE_DCHECK(output) << "output specified is NULL";

  output->clear();
  io::StringOutputStream output_stream(output);
  return PrintUnknownFields(unknown_fields, &output_stream);
}